

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

CTcPrsSymtab * __thiscall CTcCodeStream::set_local_frame(CTcCodeStream *this,CTcPrsSymtab *symtab)

{
  CTcPrsSymtab *pCVar1;
  int iVar2;
  
  pCVar1 = this->cur_frame_;
  if (pCVar1 != (CTcPrsSymtab *)0x0) {
    iVar2 = (int)(this->super_CTcDataStream).ofs_ - (int)this->method_ofs_;
    if (pCVar1->start_ofs_ == 0 || iVar2 < pCVar1->start_ofs_) {
      pCVar1->start_ofs_ = iVar2;
    }
    if (pCVar1->end_ofs_ < iVar2) {
      pCVar1->end_ofs_ = iVar2;
    }
  }
  this->cur_frame_ = symtab;
  add_local_frame(this,symtab);
  iVar2 = (int)(this->super_CTcDataStream).ofs_ - (int)this->method_ofs_;
  if (symtab->start_ofs_ == 0 || iVar2 < symtab->start_ofs_) {
    symtab->start_ofs_ = iVar2;
  }
  if (symtab->end_ofs_ < iVar2) {
    symtab->end_ofs_ = iVar2;
  }
  return pCVar1;
}

Assistant:

CTcPrsSymtab *CTcCodeStream::set_local_frame(CTcPrsSymtab *symtab)
{
    /* remember the original local frame, so we can return it later */
    CTcPrsSymtab *old_frame = cur_frame_;

    /* add the current byte code location to the outgoing frame */
    if (old_frame != 0)
        old_frame->add_to_range(ofs_ - method_ofs_);

    /* remember the current frame */
    cur_frame_ = symtab;

    /* add it to the local frame list for the method if necessary */
    add_local_frame(symtab);

    /* add the current byte code location to the incoming frame */
    symtab->add_to_range(ofs_ - method_ofs_);

    /* return the original local frame */
    return old_frame;
}